

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# end_to_end_psnr_test.cc
# Opt level: O0

void __thiscall anon_unknown.dwarf_a520a7::EndToEndTest::~EndToEndTest(EndToEndTest *this)

{
  code *pcVar1;
  EndToEndTest *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

~EndToEndTest() override = default;